

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecFlt.h
# Opt level: O0

void Vec_FltFill(Vec_Flt_t *p,int nSize,float Entry)

{
  int local_1c;
  int i;
  float Entry_local;
  int nSize_local;
  Vec_Flt_t *p_local;
  
  Vec_FltGrow(p,nSize);
  for (local_1c = 0; local_1c < nSize; local_1c = local_1c + 1) {
    p->pArray[local_1c] = Entry;
  }
  p->nSize = nSize;
  return;
}

Assistant:

static inline void Vec_FltFill( Vec_Flt_t * p, int nSize, float Entry )
{
    int i;
    Vec_FltGrow( p, nSize );
    for ( i = 0; i < nSize; i++ )
        p->pArray[i] = Entry;
    p->nSize = nSize;
}